

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_emulator.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  
  printf("Command:");
  if (1 < argc) {
    uVar1 = 1;
    do {
      printf(" \"%s\"",argv[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  putchar(10);
  return 0x2a;
}

Assistant:

int main(int argc, char * argv[] )
{
 int ii;

 printf("Command:");
 for(ii = 1; ii < argc; ++ii)
 {
 printf(" \"%s\"", argv[ii]);
 }
 printf("\n");

 return 42;
}